

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

void gauden_dump_ind(gauden_t *g,int senidx)

{
  int local_20;
  uint local_1c;
  int32 i;
  int32 d;
  int32 f;
  int senidx_local;
  gauden_t *g_local;
  
  for (i = 0; i < g->n_feat; i = i + 1) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
            ,0x4b,"Codebook %d, Feature %d (%dx%d):\n",(ulong)(uint)senidx,(ulong)(uint)i,
            g->n_density,g->featlen[i]);
    for (local_1c = 0; (int)local_1c < g->n_density; local_1c = local_1c + 1) {
      printf("m[%3d]",(ulong)local_1c);
      local_20 = 0;
      while( true ) {
        if (g->featlen[i] <= local_20) break;
        printf(" %7.4f",(double)(float)g->mean[senidx][i][(int)local_1c][local_20]);
        local_20 = local_20 + 1;
      }
      printf("\n");
    }
    printf("\n");
    for (local_1c = 0; (int)local_1c < g->n_density; local_1c = local_1c + 1) {
      printf("v[%3d]",(ulong)local_1c);
      local_20 = 0;
      while( true ) {
        if (g->featlen[i] <= local_20) break;
        printf(" %d",(ulong)(uint)(int)(float)g->var[senidx][i][(int)local_1c][local_20]);
        local_20 = local_20 + 1;
      }
      printf("\n");
    }
    printf("\n");
    for (local_1c = 0; (int)local_1c < g->n_density; local_1c = local_1c + 1) {
      printf("d[%3d] %d\n",(ulong)local_1c,(ulong)(uint)(int)(float)g->det[senidx][i][(int)local_1c]
            );
    }
  }
  fflush(_stderr);
  return;
}

Assistant:

void
gauden_dump_ind(const gauden_t * g, int senidx)
{
    int32 f, d, i;

    for (f = 0; f < g->n_feat; f++) {
        E_INFO("Codebook %d, Feature %d (%dx%d):\n",
               senidx, f, g->n_density, g->featlen[f]);

        for (d = 0; d < g->n_density; d++) {
            printf("m[%3d]", d);
            for (i = 0; i < g->featlen[f]; i++)
                printf(" %7.4f", MFCC2FLOAT(g->mean[senidx][f][d][i]));
            printf("\n");
        }
        printf("\n");

        for (d = 0; d < g->n_density; d++) {
            printf("v[%3d]", d);
            for (i = 0; i < g->featlen[f]; i++)
                printf(" %d", (int)g->var[senidx][f][d][i]);
            printf("\n");
        }
        printf("\n");

        for (d = 0; d < g->n_density; d++)
            printf("d[%3d] %d\n", d, (int)g->det[senidx][f][d]);
    }
    fflush(stderr);
}